

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

uint8_t * dtl_json_reader_parse_block(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t uVar1;
  dtl_hv_t *self_00;
  int32_t iVar2;
  uint32_t uVar3;
  char *pKey;
  uint8_t *puVar4;
  dtl_json_readerData_t *pdVar5;
  bool bVar6;
  uint8_t *pInnerResult;
  dtl_json_readerData_t *childData_1;
  dtl_json_readerData_t *childData;
  uint8_t nextChar;
  uint8_t *pResult;
  uint8_t *pNext;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  dtl_json_reader_t *self_local;
  
  pResult = pBegin;
  if (self->parseState == '\0') {
    self->parseState = '\x02';
    pResult = pBegin;
  }
  while( true ) {
    bVar6 = false;
    if ((self->parseState != '\0') && (bVar6 = false, self->parseState != '\x01')) {
      bVar6 = pResult < pEnd;
    }
    if (!bVar6) break;
    uVar1 = *pResult;
    switch(self->parseState) {
    case '\x02':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      self->parseState = '\x03';
      break;
    case '\x03':
      puVar4 = dtl_json_reader_parse_value(self,pResult,pEnd);
      if (pResult < puVar4) {
        pResult = puVar4;
      }
      break;
    case '\x04':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      if ((self->data->isArray & 1U) == 0) {
        if ((self->data->isObject & 1U) == 0) {
          self->parseState = '\0';
        }
        else {
          if (self->data->parentElem == (dtl_dv_t *)0x0) {
            __assert_fail("self->data->parentElem != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                          ,0x142,
                          "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          self_00 = (dtl_hv_t *)self->data->parentElem;
          pKey = adt_str_cstr(&self->data->objectKey);
          dtl_hv_set_cstr(self_00,pKey,self->data->currentElem,false);
          self->data->currentElem = (dtl_dv_t *)0x0;
          adt_str_clear(&self->data->objectKey);
          self->parseState = '\n';
        }
      }
      else {
        if (self->data->parentElem == (dtl_dv_t *)0x0) {
          __assert_fail("self->data->parentElem != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x13b,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        dtl_av_push((dtl_av_t *)self->data->parentElem,self->data->currentElem,false);
        self->data->currentElem = (dtl_dv_t *)0x0;
        self->parseState = '\x06';
      }
      break;
    case '\x05':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      if (pResult < pEnd) {
        if (*pResult == ']') {
          self->parseState = '\x04';
          pResult = pResult + 1;
        }
        else {
          pdVar5 = dtl_json_readerData_new();
          if (pdVar5 == (dtl_json_readerData_t *)0x0) {
            self->parseState = '\x01';
            self->lastError = 1;
          }
          else {
            pdVar5->isArray = true;
            pdVar5->parentElem = self->data->currentElem;
            adt_stack_push(&self->stack,self->data);
            self->data = pdVar5;
            self->parseState = '\x02';
          }
        }
      }
      break;
    case '\x06':
      if (uVar1 == ',') {
        self->parseState = '\x02';
        pResult = pResult + 1;
      }
      else if (uVar1 == ']') {
        dtl_dv_inc_ref(self->data->currentElem);
        dtl_json_readerData_delete(self->data);
        uVar3 = adt_stack_size(&self->stack);
        if (uVar3 == 0) {
          __assert_fail("adt_stack_size(&self->stack) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x177,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        pdVar5 = (dtl_json_readerData_t *)adt_stack_top(&self->stack);
        self->data = pdVar5;
        adt_stack_pop(&self->stack);
        self->parseState = '\x04';
        pResult = pResult + 1;
      }
      else {
        self->parseState = '\x01';
        self->lastError = 2;
      }
      break;
    case '\a':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      if (pResult < pEnd) {
        if (*pResult == '}') {
          self->parseState = '\x04';
          pResult = pResult + 1;
        }
        else {
          pdVar5 = dtl_json_readerData_new();
          if (pdVar5 == (dtl_json_readerData_t *)0x0) {
            self->parseState = '\x01';
            self->lastError = 1;
          }
          else {
            pdVar5->isObject = true;
            pdVar5->parentElem = self->data->currentElem;
            adt_stack_push(&self->stack,self->data);
            self->data = pdVar5;
            self->parseState = '\b';
          }
        }
      }
      break;
    case '\b':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      if (pResult < pEnd) {
        if (*pResult == '\"') {
          puVar4 = bstr_parse_json_string_literal(&self->ctx,pResult,pEnd,&self->data->objectKey);
          if (pResult < puVar4) {
            iVar2 = adt_str_length(&self->data->objectKey);
            pResult = puVar4;
            if (iVar2 == 0) {
              self->parseState = '\x01';
              self->lastError = 4;
            }
            else {
              self->parseState = '\t';
            }
          }
          else {
            self->parseState = '\x01';
            self->lastError = 5;
          }
        }
        else {
          self->parseState = '\x01';
          self->lastError = 2;
        }
      }
      break;
    case '\t':
      pResult = dtl_json_reader_lstrip(self,pResult,pEnd);
      if ((pResult < pEnd) && (*pResult == ':')) {
        self->parseState = '\x02';
        pResult = pResult + 1;
      }
      break;
    case '\n':
      if (uVar1 == ',') {
        self->parseState = '\b';
        pResult = pResult + 1;
      }
      else if (uVar1 == '}') {
        dtl_dv_inc_ref(self->data->currentElem);
        dtl_json_readerData_delete(self->data);
        uVar3 = adt_stack_size(&self->stack);
        if (uVar3 == 0) {
          __assert_fail("adt_stack_size(&self->stack) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                        ,0x1dc,
                        "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        pdVar5 = (dtl_json_readerData_t *)adt_stack_top(&self->stack);
        self->data = pdVar5;
        adt_stack_pop(&self->stack);
        self->parseState = '\x04';
        pResult = pResult + 1;
      }
      else {
        self->parseState = '\x01';
        self->lastError = 2;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                    ,0x1e8,
                    "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                   );
    }
  }
  if (self->parseState == '\x01') {
    dtl_av_delete((dtl_av_t *)self->data->currentElem);
  }
  return pResult;
}

Assistant:

static const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;

   if (self->parseState == PARSE_STATE_NONE)
   {
      self->parseState = PARSE_STATE_PRE_VALUE;
   }
   while( (self->parseState != PARSE_STATE_NONE) && (self->parseState != PARSE_STATE_ERROR) && (pNext < pEnd) )
   {
      const uint8_t *pResult;
      uint8_t nextChar = *pNext;

      switch(self->parseState)
      {
      case PARSE_STATE_PRE_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         self->parseState = PARSE_STATE_VALUE;
         break;
      case PARSE_STATE_VALUE:
         pResult = dtl_json_reader_parse_value(self, pNext, pEnd);
         if (pResult > pNext)
         {
            pNext = pResult;
         }
         break;
      case PARSE_STATE_POST_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if (self->data->isArray)
         {
            assert(self->data->parentElem != 0);
            dtl_av_push((dtl_av_t*) self->data->parentElem, self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            self->parseState = PARSE_STATE_ARRAY_NEXT;
         }
         else if (self->data->isObject)
         {
            assert(self->data->parentElem != 0);
            dtl_hv_set_cstr((dtl_hv_t*) self->data->parentElem, adt_str_cstr(&self->data->objectKey), self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            adt_str_clear(&self->data->objectKey);
            self->parseState = PARSE_STATE_OBJECT_NEXT;
         }
         else
         {
            self->parseState = PARSE_STATE_NONE;
         }
         break;
      case PARSE_STATE_ARRAY_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==']')
            {
               //empty array, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isArray = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_PRE_VALUE;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_ARRAY_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_PRE_VALUE;
         }
         else if(nextChar == ']')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      case PARSE_STATE_OBJECT_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='}')
            {
               //empty object, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isObject = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_OBJECT_KEY;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_OBJECT_KEY:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='"')
            {
               const uint8_t *pInnerResult;
               pInnerResult = bstr_parse_json_string_literal(&self->ctx, pNext, pEnd, &self->data->objectKey);
               if (pInnerResult > pNext)
               {
                  pNext = pInnerResult;
                  if (adt_str_length(&self->data->objectKey) == 0)
                  {
                     self->parseState = PARSE_STATE_ERROR;
                     self->lastError = DTL_JSON_EMPTY_KEY_ERROR;
                  }
                  else
                  {
                     self->parseState = PARSE_STATE_OBJECT_SEP;
                  }
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_UNMATCHED_STRING_LITERAL;
               }
            }
            //TODO: We should probably allow stray comma here to make it easier for the user
            else
            {
               self->parseState = PARSE_STATE_ERROR;
               self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
            }
         }
         break;
      case PARSE_STATE_OBJECT_SEP:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==':')
            {
               pNext++;
               self->parseState = PARSE_STATE_PRE_VALUE;
            }
         }
         break;
      case PARSE_STATE_OBJECT_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_OBJECT_KEY;
         }
         else if(nextChar == '}')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      default:
         assert(0);
      }
   }
   if (self->parseState == PARSE_STATE_ERROR)
   {
      dtl_av_delete((dtl_av_t*) self->data->currentElem);
   }
   return pNext;
}